

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

int write_VD(archive_write *a,vdd *vdd)

{
  uchar *bp;
  iso9660_conflict *iso9660_00;
  size_t sVar1;
  undefined1 uVar2;
  int iVar3;
  undefined1 uVar4;
  iso9660_conflict *iso9660;
  undefined1 uVar5;
  vdc vdc;
  char identifier [256];
  utsname local_1b6;
  
  iso9660_00 = (iso9660_conflict *)a->format_data;
  if (vdd->vdd_type == VDD_JOLIET) {
    uVar5 = 1;
    vdc = VDC_UCS2;
    uVar2 = 2;
  }
  else if (vdd->vdd_type == VDD_ENHANCED) {
    vdc = VDC_LOWERCASE;
    uVar2 = 2;
    uVar5 = 2;
  }
  else {
    vdc = VDC_STD;
    uVar2 = 1;
    uVar5 = 1;
  }
  sVar1 = iso9660_00->wbuff_remaining;
  bp = (uchar *)((long)iso9660_00 + (0x102db - sVar1));
  *(undefined1 *)((long)iso9660_00 + (0x102dc - sVar1)) = uVar2;
  *(undefined4 *)((long)iso9660_00 + (0x102dd - sVar1)) = 0x30304443;
  *(undefined1 *)((long)iso9660_00 + (0x102e1 - sVar1)) = 0x31;
  *(undefined1 *)((long)iso9660_00 + (0x102e2 - sVar1)) = uVar5;
  *(undefined1 *)((long)iso9660_00 + (0x102e3 - sVar1)) = 0;
  uname(&local_1b6);
  strncpy(identifier,local_1b6.sysname,0xff);
  identifier[0xff] = '\0';
  iVar3 = set_str_a_characters_bp(a,bp,9,0x28,identifier,vdc);
  if (iVar3 == 0) {
    iVar3 = set_str_d_characters_bp(a,bp,0x29,0x48,(iso9660_00->volume_identifier).s,vdc);
    if (iVar3 == 0) {
      *(undefined8 *)((long)iso9660_00 + (0x10324 - sVar1)) = 0;
      set_num_733((uchar *)((long)iso9660_00 + (0x1032c - sVar1)),iso9660_00->volume_space_size);
      if (vdd->vdd_type == VDD_JOLIET) {
        *(undefined2 *)((long)iso9660_00 + (0x10334 - sVar1)) = 0x2f25;
        *(undefined1 *)((long)iso9660_00 + (0x10336 - sVar1)) = 0x45;
        *(undefined8 *)((long)iso9660_00 + (0x10337 - sVar1)) = 0;
        *(undefined8 *)((long)iso9660_00 + (0x1033f - sVar1)) = 0;
        *(undefined8 *)((long)iso9660_00 + (0x10344 - sVar1)) = 0;
        *(undefined8 *)((long)iso9660_00 + (0x1034c - sVar1)) = 0;
      }
      else {
        *(undefined8 *)((long)iso9660_00 + (0x10344 - sVar1)) = 0;
        *(undefined8 *)((long)iso9660_00 + (0x1034c - sVar1)) = 0;
        *(undefined8 *)((long)iso9660_00 + (0x10334 - sVar1)) = 0;
        *(undefined8 *)((long)iso9660_00 + (0x1033c - sVar1)) = 0;
      }
      *(undefined4 *)((long)iso9660_00 + (0x10354 - sVar1)) = 0x1000001;
      iVar3 = iso9660_00->volume_sequence_number;
      uVar2 = (undefined1)iVar3;
      *(undefined1 *)((long)iso9660_00 + (0x10358 - sVar1)) = uVar2;
      uVar4 = (undefined1)((uint)iVar3 >> 8);
      *(undefined1 *)((long)iso9660_00 + (0x10359 - sVar1)) = uVar4;
      *(undefined1 *)((long)iso9660_00 + (0x1035a - sVar1)) = uVar4;
      *(undefined1 *)((long)iso9660_00 + (0x1035b - sVar1)) = uVar2;
      *(undefined4 *)((long)iso9660_00 + (0x1035c - sVar1)) = 0x80800;
      set_num_733((uchar *)((long)iso9660_00 + (0x10360 - sVar1)),vdd->path_table_size);
      iVar3 = vdd->location_type_L_path_table;
      *(char *)((long)iso9660_00 + (0x10368 - sVar1)) = (char)iVar3;
      *(char *)((long)iso9660_00 + (0x10369 - sVar1)) = (char)((uint)iVar3 >> 8);
      *(char *)((long)iso9660_00 + (0x1036a - sVar1)) = (char)((uint)iVar3 >> 0x10);
      *(char *)((long)iso9660_00 + (0x1036b - sVar1)) = (char)((uint)iVar3 >> 0x18);
      *(undefined4 *)((long)iso9660_00 + (0x1036c - sVar1)) = 0;
      iVar3 = vdd->location_type_M_path_table;
      *(char *)((long)iso9660_00 + (0x10370 - sVar1)) = (char)((uint)iVar3 >> 0x18);
      *(char *)((long)iso9660_00 + (0x10371 - sVar1)) = (char)((uint)iVar3 >> 0x10);
      *(char *)((long)iso9660_00 + (0x10372 - sVar1)) = (char)((uint)iVar3 >> 8);
      *(char *)((long)iso9660_00 + (0x10373 - sVar1)) = (char)iVar3;
      *(undefined4 *)((long)iso9660_00 + (0x10374 - sVar1)) = 0;
      set_directory_record
                ((uchar *)((long)iso9660_00 + (0x10378 - sVar1)),0x22,vdd->rootent,iso9660_00,
                 DIR_REC_VD,vdd->vdd_type);
      iVar3 = set_str_d_characters_bp(a,bp,0xbf,0x13e,"",vdc);
      if (iVar3 == 0) {
        iVar3 = set_file_identifier(bp,0x13f,0x1be,vdc,a,vdd,&iso9660_00->publisher_identifier,
                                    "Publisher File",1,A_CHAR);
        if (iVar3 == 0) {
          iVar3 = set_file_identifier(bp,0x1bf,0x23e,vdc,a,vdd,&iso9660_00->data_preparer_identifier
                                      ,"Data Preparer File",1,A_CHAR);
          if (iVar3 == 0) {
            iVar3 = set_file_identifier(bp,0x23f,0x2be,vdc,a,vdd,&iso9660_00->application_identifier
                                        ,"Application File",1,A_CHAR);
            if (iVar3 == 0) {
              iVar3 = set_file_identifier(bp,0x2bf,0x2e3,vdc,a,vdd,
                                          &iso9660_00->copyright_file_identifier,"Copyright File",0,
                                          D_CHAR);
              if (iVar3 == 0) {
                iVar3 = set_file_identifier(bp,0x2e4,0x308,vdc,a,vdd,
                                            &iso9660_00->abstract_file_identifier,"Abstract File",0,
                                            D_CHAR);
                if (iVar3 == 0) {
                  iVar3 = set_file_identifier(bp,0x309,0x32d,vdc,a,vdd,
                                              &iso9660_00->bibliographic_file_identifier,
                                              "Bibliongraphic File",0,D_CHAR);
                  if (iVar3 == 0) {
                    set_date_time((uchar *)((long)iso9660_00 + (0x10609 - sVar1)),
                                  iso9660_00->birth_time);
                    set_date_time((uchar *)((long)iso9660_00 + (0x1061a - sVar1)),
                                  iso9660_00->birth_time);
                    *(undefined8 *)((long)iso9660_00 + (0x1062b - sVar1)) = 0x3030303030303030;
                    *(undefined8 *)((long)iso9660_00 + (0x10633 - sVar1)) = 0x3030303030303030;
                    *(undefined1 *)((long)iso9660_00 + (0x1063b - sVar1)) = 0;
                    set_date_time((uchar *)((long)iso9660_00 + (0x1063c - sVar1)),
                                  iso9660_00->birth_time);
                    *(undefined1 *)((long)iso9660_00 + (0x1064d - sVar1)) = uVar5;
                    *(undefined1 *)((long)iso9660_00 + (0x1064e - sVar1)) = 0;
                    memset((void *)((long)iso9660_00 + (0x1064f - sVar1)),0x20,0x200);
                    memset((void *)((long)iso9660_00 + (0x1084f - sVar1)),0,0x28d);
                    iVar3 = wb_consume(a,0x800);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int
write_VD(struct archive_write *a, struct vdd *vdd)
{
	struct iso9660 *iso9660;
	unsigned char *bp;
	uint16_t volume_set_size = 1;
	char identifier[256];
	enum VD_type vdt;
	enum vdc vdc;
	unsigned char vd_ver, fst_ver;
	int r;

	iso9660 = a->format_data;
	switch (vdd->vdd_type) {
	case VDD_JOLIET:
		vdt = VDT_SUPPLEMENTARY;
		vd_ver = fst_ver = 1;
		vdc = VDC_UCS2;
		break;
	case VDD_ENHANCED:
		vdt = VDT_SUPPLEMENTARY;
		vd_ver = fst_ver = 2;
		vdc = VDC_LOWERCASE;
		break;
	case VDD_PRIMARY:
	default:
		vdt = VDT_PRIMARY;
		vd_ver = fst_ver = 1;
#ifdef COMPAT_MKISOFS
		vdc = VDC_LOWERCASE;
#else
		vdc = VDC_STD;
#endif
		break;
	}

	bp = wb_buffptr(a) -1;
	/* Volume Descriptor Type */
	set_VD_bp(bp, vdt, vd_ver);
	/* Unused Field */
	set_unused_field_bp(bp, 8, 8);
	/* System Identifier */
	get_system_identifier(identifier, sizeof(identifier));
	r = set_str_a_characters_bp(a, bp, 9, 40, identifier, vdc);
	if (r != ARCHIVE_OK)
		return (r);
	/* Volume Identifier */
	r = set_str_d_characters_bp(a, bp, 41, 72,
	    iso9660->volume_identifier.s, vdc);
	if (r != ARCHIVE_OK)
		return (r);
	/* Unused Field */
	set_unused_field_bp(bp, 73, 80);
	/* Volume Space Size */
	set_num_733(bp+81, iso9660->volume_space_size);
	if (vdd->vdd_type == VDD_JOLIET) {
		/* Escape Sequences */
		bp[89] = 0x25;/* UCS-2 Level 3 */
		bp[90] = 0x2F;
		bp[91] = 0x45;
		memset(bp + 92, 0, 120 - 92 + 1);
	} else {
		/* Unused Field */
		set_unused_field_bp(bp, 89, 120);
	}
	/* Volume Set Size */
	set_num_723(bp+121, volume_set_size);
	/* Volume Sequence Number */
	set_num_723(bp+125, iso9660->volume_sequence_number);
	/* Logical Block Size */
	set_num_723(bp+129, LOGICAL_BLOCK_SIZE);
	/* Path Table Size */
	set_num_733(bp+133, vdd->path_table_size);
	/* Location of Occurrence of Type L Path Table */
	set_num_731(bp+141, vdd->location_type_L_path_table);
	/* Location of Optional Occurrence of Type L Path Table */
	set_num_731(bp+145, 0);
	/* Location of Occurrence of Type M Path Table */
	set_num_732(bp+149, vdd->location_type_M_path_table);
	/* Location of Optional Occurrence of Type M Path Table */
	set_num_732(bp+153, 0);
	/* Directory Record for Root Directory(BP 157 to 190) */
	set_directory_record(bp+157, 190-157+1, vdd->rootent,
	    iso9660, DIR_REC_VD, vdd->vdd_type);
	/* Volume Set Identifier */
	r = set_str_d_characters_bp(a, bp, 191, 318, "", vdc);
	if (r != ARCHIVE_OK)
		return (r);
	/* Publisher Identifier */
	r = set_file_identifier(bp, 319, 446, vdc, a, vdd,
	    &(iso9660->publisher_identifier),
	    "Publisher File", 1, A_CHAR);
	if (r != ARCHIVE_OK)
		return (r);
	/* Data Preparer Identifier */
	r = set_file_identifier(bp, 447, 574, vdc, a, vdd,
	    &(iso9660->data_preparer_identifier),
	    "Data Preparer File", 1, A_CHAR);
	if (r != ARCHIVE_OK)
		return (r);
	/* Application Identifier */
	r = set_file_identifier(bp, 575, 702, vdc, a, vdd,
	    &(iso9660->application_identifier),
	    "Application File", 1, A_CHAR);
	if (r != ARCHIVE_OK)
		return (r);
	/* Copyright File Identifier */
	r = set_file_identifier(bp, 703, 739, vdc, a, vdd,
	    &(iso9660->copyright_file_identifier),
	    "Copyright File", 0, D_CHAR);
	if (r != ARCHIVE_OK)
		return (r);
	/* Abstract File Identifier */
	r = set_file_identifier(bp, 740, 776, vdc, a, vdd,
	    &(iso9660->abstract_file_identifier),
	    "Abstract File", 0, D_CHAR);
	if (r != ARCHIVE_OK)
		return (r);
	/* Bibliographic File Identifier */
	r = set_file_identifier(bp, 777, 813, vdc, a, vdd,
	    &(iso9660->bibliographic_file_identifier),
	    "Bibliongraphic File", 0, D_CHAR);
	if (r != ARCHIVE_OK)
		return (r);
	/* Volume Creation Date and Time */
	set_date_time(bp+814, iso9660->birth_time);
	/* Volume Modification Date and Time */
	set_date_time(bp+831, iso9660->birth_time);
	/* Volume Expiration Date and Time(obsolete) */
	set_date_time_null(bp+848);
	/* Volume Effective Date and Time */
	set_date_time(bp+865, iso9660->birth_time);
	/* File Structure Version */
	bp[882] = fst_ver;
	/* Reserved */
	bp[883] = 0;
	/* Application Use */
	memset(bp + 884, 0x20, 1395 - 884 + 1);
	/* Reserved */
	set_unused_field_bp(bp, 1396, LOGICAL_BLOCK_SIZE);

	return (wb_consume(a, LOGICAL_BLOCK_SIZE));
}